

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O2

bool __thiscall
HighsHashTable<int,_int>::findPosition
          (HighsHashTable<int,_int> *this,KeyType_conflict *key,u8 *meta,u64 *startPos,u64 *maxPos,
          u64 *pos)

{
  byte bVar1;
  int iVar2;
  _Head_base<0UL,_HighsHashTableEntry<int,_int>_*,_false> _Var3;
  uchar *puVar4;
  ulong uVar5;
  ulong uVar6;
  u64 uVar7;
  
  uVar5 = (ulong)(uint)*key * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20 ^
          (ulong)(uint)*key * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32;
  uVar6 = uVar5 >> ((byte)this->numHashShift & 0x3f);
  *startPos = uVar6;
  *maxPos = uVar6 + 0x7f & this->tableSizeMask;
  *meta = (byte)(uVar5 >> ((byte)this->numHashShift & 0x3f)) | 0x80;
  _Var3._M_head_impl =
       (this->entries)._M_t.
       super___uniq_ptr_impl<HighsHashTableEntry<int,_int>,_HighsHashTable<int,_int>::OpNewDeleter>.
       _M_t.
       super__Tuple_impl<0UL,_HighsHashTableEntry<int,_int>_*,_HighsHashTable<int,_int>::OpNewDeleter>
       .super__Head_base<0UL,_HighsHashTableEntry<int,_int>_*,_false>._M_head_impl;
  uVar7 = *startPos;
  *pos = uVar7;
  puVar4 = (this->metadata)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  iVar2 = *key;
  do {
    bVar1 = puVar4[uVar7];
    if (-1 < (char)bVar1) {
      return false;
    }
    if ((bVar1 == *meta) && (iVar2 == _Var3._M_head_impl[uVar7].key_)) {
      return true;
    }
    if ((ulong)((int)uVar7 - (uint)bVar1 & 0x7f) < (uVar7 - *startPos & this->tableSizeMask)) {
      return false;
    }
    uVar7 = uVar7 + 1 & this->tableSizeMask;
    *pos = uVar7;
  } while (uVar7 != *maxPos);
  return false;
}

Assistant:

bool findPosition(const KeyType& key, u8& meta, u64& startPos, u64& maxPos,
                    u64& pos) const {
    u64 hash = HighsHashHelpers::hash(key);
    startPos = hash >> numHashShift;
    maxPos = (startPos + maxDistance()) & tableSizeMask;
    meta = toMetadata(hash);

    const Entry* entryArray = entries.get();
    pos = startPos;
    do {
      if (!occupied(metadata[pos])) return false;
      if (metadata[pos] == meta &&
          HighsHashHelpers::equal(key, entryArray[pos].key()))
        return true;

      u64 currentDistance = (pos - startPos) & tableSizeMask;
      if (currentDistance > distanceFromIdealSlot(pos)) return false;

      pos = (pos + 1) & tableSizeMask;
    } while (pos != maxPos);

    return false;
  }